

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

TimingOf<std::chrono::_V2::system_clock,_std::vector<double>_(*(run_for_at_least_argument_t<system_clock,_vector<double,_allocator<double>_>_(*)(int)>))(int)>
* __thiscall
nonius::detail::
run_for_at_least<std::chrono::_V2::system_clock,std::vector<double,std::allocator<double>>(*)(int)>
          (TimingOf<std::chrono::_V2::system_clock,_std::vector<double>_(*(run_for_at_least_argument_t<system_clock,_vector<double,_allocator<double>_>_(*)(int)>))(int)>
           *__return_storage_ptr__,detail *this,parameters *params,
          Duration<std::chrono::_V2::system_clock> how_long,int seed,
          _func_vector<double,_std::allocator<double>_>_int **fun)

{
  duration<long,_std::ratio<1L,_1000000000L>_> dVar1;
  undefined8 *puVar2;
  int iVar3;
  ulong uVar4;
  undefined4 in_register_00000084;
  int local_7c;
  vector<double,_std::allocator<double>_> local_78;
  TimingOf<std::chrono::_V2::system_clock,_std::vector<double>_(*&(int_&))(int)> local_58;
  
  uVar4 = how_long.__r & 0xffffffff;
  do {
    iVar3 = (int)uVar4;
    if (0x3fffffff < iVar3) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = &PTR__exception_0020c2b0;
      __cxa_throw(puVar2,&optimized_away_error::typeinfo,std::exception::~exception);
    }
    local_7c = iVar3;
    measure<std::chrono::_V2::system_clock,std::vector<double,std::allocator<double>>(*&)(int),int&>
              (&local_58,(detail *)CONCAT44(in_register_00000084,seed),
               (_func_vector<double,_std::allocator<double>_>_int **)&local_7c,(int *)how_long.__r);
    dVar1.__r = local_58.elapsed.__r;
    if (local_58.elapsed.__r < (long)params) {
      uVar4 = (ulong)(uint)(iVar3 * 2);
    }
    else {
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = local_58.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_58.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_58.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_58.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->elapsed).__r = local_58.elapsed.__r;
      std::vector<double,_std::allocator<double>_>::vector
                (&__return_storage_ptr__->result,&local_78);
      __return_storage_ptr__->iterations = iVar3;
      if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if (local_58.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.result.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.result.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  } while (dVar1.__r < (long)params);
  return __return_storage_ptr__;
}

Assistant:

TimingOf<Clock, Fun(run_for_at_least_argument_t<Clock, Fun>)> run_for_at_least(const parameters& params, Duration<Clock> how_long, int seed, Fun&& fun) {
            auto iters = seed;
            while(iters < (1 << 30)) {
                auto&& timing = measure_one<Clock>(fun, iters, params, detail::is_callable<Fun(chronometer)>());

                if(timing.elapsed >= how_long) {
                    return { timing.elapsed, std::move(timing.result), iters };
                }
                iters *= 2;
            }
            throw optimized_away_error{};
        }